

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt32emu-smf2wav.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ReportHandler2 *__s;
  Service SVar1;
  bool bVar2;
  mt32emu_return_code mVar3;
  Bit32u sampleRate;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  void *pvVar8;
  char *pcVar9;
  gchar *displayInputFilename;
  clock_t cVar10;
  int local_1a8;
  int local_1a4;
  int i_2;
  int i_1;
  char *inputFilenameLocale;
  char *inputFilenameUtf8;
  gchar **inputFilename;
  undefined1 auStack_180 [4];
  int i;
  State state;
  clock_t startTime;
  FILE *pFStack_108;
  bool outputFileExists;
  FILE *outputFile;
  char *outputFilenameLocale;
  char *outputFilenameUtf8;
  size_t allocLen;
  gchar *lastInputFilename;
  gchar *outputFilename;
  char *mt32emuVersion;
  Service service;
  Options options;
  char **argv_local;
  int argc_local;
  
  MT32Emu::Service::Service((Service *)&mt32emuVersion,(mt32emu_context)0x0);
  setlocale(6,"");
  pcVar5 = MT32Emu::Service::getLibraryVersionString((Service *)&mt32emuVersion);
  printf("Munt MT32Emu MIDI to Wave Conversion Utility. Version %s\n","1.9.0");
  printf("  Copyright (C) 2009, 2011 Jerome Fisher <re_munt@kingguppy.com>\n");
  printf("  Copyright (C) 2012-2022 Jerome Fisher, Sergey V. Mikayev\n");
  pcVar6 = smf_get_version();
  printf("Using Munt MT32Emu Library Version %s, libsmf Version %s (with modifications)\n",pcVar5,
         pcVar6);
  bVar2 = parseOptions(argc,argv,(Options *)&service);
  SVar1 = service;
  if (bVar2) {
    if (options.inputFilenames == (gchar **)0x0) {
      iVar4 = g_strv_length();
      __s = (&(SVar1.c)->reportHandler)[iVar4 - 1];
      sVar7 = strlen((char *)__s);
      lastInputFilename = (gchar *)operator_new__(sVar7 + 5);
      if (lastInputFilename == (char *)0x0) {
        fprintf(_stderr,"Error allocating %lu bytes for destination filename.\n",sVar7 + 5);
        argv_local._4_4_ = -1;
        goto LAB_00109167;
      }
      if (options.rawChannelMap[6] < 1) {
        sprintf(lastInputFilename,"%s.wav",__s);
      }
      else {
        sprintf(lastInputFilename,"%s.raw",__s);
      }
    }
    else {
      lastInputFilename = (gchar *)options.inputFilenames;
    }
    MT32Emu::Service::createContext
              ((Service *)&mt32emuVersion,(mt32emu_report_handler_i)0x0,(void *)0x0);
    bVar2 = loadROMs((Service *)&mt32emuVersion,(Options *)&service);
    if (bVar2) {
      MT32Emu::Service::setStereoOutputSampleRate
                ((Service *)&mt32emuVersion,(double)options.machineID._4_4_);
      MT32Emu::Service::setSamplerateConversionQuality
                ((Service *)&mt32emuVersion,options.analogOutputMode);
      MT32Emu::Service::setPartialCount((Service *)&mt32emuVersion,options.rendererType);
      MT32Emu::Service::setAnalogOutputMode((Service *)&mt32emuVersion,options.outputSampleFormat);
      MT32Emu::Service::selectRendererType((Service *)&mt32emuVersion,options.dacInputMode);
      mVar3 = MT32Emu::Service::openSynth((Service *)&mt32emuVersion);
      if (mVar3 == MT32EMU_RC_OK) {
        MT32Emu::Service::setDACInputMode((Service *)&mt32emuVersion,options.sampleRate);
        if (options.waitForReverb == 0) {
          MT32Emu::Service::setNiceAmpRampEnabled((Service *)&mt32emuVersion,false);
        }
        if (options.sendAllNotesOff != 0) {
          MT32Emu::Service::setNicePanningEnabled((Service *)&mt32emuVersion,true);
        }
        if (options.niceAmpRamp != 0) {
          MT32Emu::Service::setNicePartialMixingEnabled((Service *)&mt32emuVersion,true);
        }
        sampleRate = MT32Emu::Service::getActualStereoOutputSamplerate((Service *)&mt32emuVersion);
        printf("Using output sample rate %d Hz\n",(ulong)sampleRate);
        sVar7 = strlen(lastInputFilename);
        pcVar5 = (char *)g_filename_to_utf8(lastInputFilename,sVar7,0,0);
        sVar7 = strlen(pcVar5);
        pcVar6 = (char *)g_locale_from_utf8(pcVar5,sVar7,0,0);
        bVar2 = false;
        if ((int)options.outputFilename == 0) {
          iVar4 = g_file_test(lastInputFilename,0x10);
          bVar2 = iVar4 != 0;
        }
        if (bVar2) {
          fprintf(_stderr,"Destination file \'%s\' exists.\n",pcVar6);
          pFStack_108 = (FILE *)0x0;
        }
        else {
          pFStack_108 = fopen(pcVar6,"wb");
        }
        state.writtenFrames = clock();
        if (pFStack_108 == (FILE *)0x0) {
          fprintf(_stderr,"Error opening file \'%s\' for writing.\n",pcVar6);
        }
        else {
          if ((0 < options.rawChannelMap[6]) ||
             (bVar2 = writeWAVEHeader((FILE *)pFStack_108,sampleRate,options.bufferFrameCount),
             bVar2)) {
            _auStack_180 = (void *)0x0;
            memcpy(&state,&DAT_00135c58,0x30);
            state.rawSampleBuffer[5] = &mt32emuVersion;
            state.outputFile._0_1_ = 0;
            state.outputFile._1_1_ = 0;
            state.lastInputFile = false;
            state.firstNoiseEncountered = false;
            state._74_6_ = 0;
            state.unwrittenSilentFrames = 0;
            state.renderedFrames = 0;
            state.service = (Service *)pFStack_108;
            if (options.rawChannelMap[6] < 1) {
              if (options.bufferFrameCount == 1) {
                _auStack_180 = operator_new__((ulong)((uint)options.machineID * 2) << 2);
              }
              else {
                _auStack_180 = operator_new__((ulong)((uint)options.machineID * 2) * 2);
              }
            }
            else {
              for (inputFilename._4_4_ = 0; inputFilename._4_4_ < 6;
                  inputFilename._4_4_ = inputFilename._4_4_ + 1) {
                if (options.bufferFrameCount == 1) {
                  pvVar8 = operator_new__((ulong)(uint)options.machineID << 2);
                  state.rawSampleBuffer[(long)inputFilename._4_4_ + -1] = pvVar8;
                }
                else {
                  pvVar8 = operator_new__((ulong)(uint)options.machineID * 2);
                  state.rawSampleBuffer[(long)inputFilename._4_4_ + -1] = pvVar8;
                }
              }
            }
            inputFilenameUtf8 = (char *)service.c;
            while (*(long *)inputFilenameUtf8 != 0) {
              pcVar9 = *(char **)inputFilenameUtf8;
              sVar7 = strlen(pcVar9);
              pcVar9 = (char *)g_filename_to_utf8(pcVar9,sVar7,0,0);
              sVar7 = strlen(pcVar9);
              displayInputFilename = (gchar *)g_locale_from_utf8(pcVar9,sVar7,0,0);
              state.outputFile._0_1_ = *(long *)(inputFilenameUtf8 + 8) == 0;
              playFile(*(gchar **)inputFilenameUtf8,displayInputFilename,(Options *)&service,
                       (State *)auStack_180);
              inputFilenameUtf8 = inputFilenameUtf8 + 8;
              g_free(displayInputFilename);
              g_free(pcVar9);
            }
            if (options.bufferFrameCount == 1) {
              if (_auStack_180 != (void *)0x0) {
                operator_delete__(_auStack_180);
              }
              for (local_1a4 = 0; local_1a4 < 6; local_1a4 = local_1a4 + 1) {
                if (state.rawSampleBuffer[(long)local_1a4 + -1] != (void *)0x0) {
                  operator_delete__(state.rawSampleBuffer[(long)local_1a4 + -1]);
                }
              }
            }
            else {
              if (_auStack_180 != (void *)0x0) {
                operator_delete__(_auStack_180);
              }
              for (local_1a8 = 0; local_1a8 < 6; local_1a8 = local_1a8 + 1) {
                if (state.rawSampleBuffer[(long)local_1a8 + -1] != (void *)0x0) {
                  operator_delete__(state.rawSampleBuffer[(long)local_1a8 + -1]);
                }
              }
            }
            if (options.rawChannelMap[6] == 0) {
              bVar2 = fillWAVESizes((FILE *)pFStack_108,(int)state.renderedFrames,
                                    options.bufferFrameCount);
              if (!bVar2) {
                fprintf(_stderr,"Error writing final sizes to WAVE header\n");
              }
            }
          }
          else {
            fprintf(_stderr,"Error writing WAVE header to \'%s\'\n",pcVar6);
          }
          fclose(pFStack_108);
          cVar10 = clock();
          printf("Elapsed time: %f sec\n",
                 (double)((float)(long)(cVar10 - state.writtenFrames) / 1e+06));
        }
        g_free(pcVar6);
        g_free(pcVar5);
      }
      else {
        fprintf(_stderr,"Error opening MT32Emu synthesizer.\n");
      }
      MT32Emu::Service::freeContext((Service *)&mt32emuVersion);
      if (((options.inputFilenames == (gchar **)0x0) && (lastInputFilename != (gchar *)0x0)) &&
         (lastInputFilename != (gchar *)0x0)) {
        operator_delete__(lastInputFilename);
      }
      freeOptions((Options *)&service);
      argv_local._4_4_ = 0;
    }
    else {
      MT32Emu::Service::freeContext((Service *)&mt32emuVersion);
      if (((options.inputFilenames == (gchar **)0x0) && (lastInputFilename != (gchar *)0x0)) &&
         (lastInputFilename != (gchar *)0x0)) {
        operator_delete__(lastInputFilename);
      }
      freeOptions((Options *)&service);
      argv_local._4_4_ = 1;
    }
  }
  else {
    argv_local._4_4_ = -1;
  }
LAB_00109167:
  MT32Emu::Service::~Service((Service *)&mt32emuVersion);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
	Options options;
	MT32Emu::Service service;
	setlocale(LC_ALL, "");
#ifdef BUILD_MT32EMU_VERSION
	const char *mt32emuVersion = BUILD_MT32EMU_VERSION;
#else
	const char *mt32emuVersion = service.getLibraryVersionString();
#endif
	printf("Munt MT32Emu MIDI to Wave Conversion Utility. Version %s\n", MT32EMU_SMF2WAV_VERSION);
	printf("  Copyright (C) 2009, 2011 Jerome Fisher <re_munt@kingguppy.com>\n");
	printf("  Copyright (C) 2012-2022 Jerome Fisher, Sergey V. Mikayev\n");
	printf("Using Munt MT32Emu Library Version %s, libsmf Version %s (with modifications)\n", mt32emuVersion, smf_get_version());
	if (!parseOptions(argc, argv, &options)) {
		return -1;
	}
	gchar *outputFilename;
	if (options.outputFilename != NULL) {
		outputFilename = options.outputFilename;
	} else {
		gchar *lastInputFilename = options.inputFilenames[g_strv_length(options.inputFilenames) - 1];
		size_t allocLen = strlen(lastInputFilename) + 5;
		outputFilename = new gchar[allocLen];
		if(outputFilename == NULL) {
			fprintf(stderr, "Error allocating %lu bytes for destination filename.\n", (unsigned long)allocLen);
			return -1;
		}
		if (options.rawChannelCount > 0) {
			sprintf(outputFilename, "%s.raw", lastInputFilename);
		} else {
			sprintf(outputFilename, "%s.wav", lastInputFilename);
		}
	}

	service.createContext();
	if (!loadROMs(service, options)) {
		service.freeContext();

		if (options.outputFilename == NULL && outputFilename != NULL) {
			delete[] outputFilename;
		}
		freeOptions(&options);
		return 1;
	}
	service.setStereoOutputSampleRate(options.sampleRate);
	service.setSamplerateConversionQuality(options.srcQuality);
	service.setPartialCount(options.partialCount);
	service.setAnalogOutputMode(options.analogOutputMode);
	service.selectRendererType(options.rendererType);
	if (service.openSynth() == MT32EMU_RC_OK) {
		service.setDACInputMode(options.dacInputMode);
		if (!options.niceAmpRamp) {
			service.setNiceAmpRampEnabled(false);
		}
		if (options.nicePanning) {
			service.setNicePanningEnabled(true);
		}
		if (options.nicePartialMixing) {
			service.setNicePartialMixingEnabled(true);
		}
		options.sampleRate = service.getActualStereoOutputSamplerate();
		printf("Using output sample rate %d Hz\n", options.sampleRate);

		char *outputFilenameUtf8 = g_filename_to_utf8(outputFilename, strlen(outputFilename), NULL, NULL, NULL);
		char *outputFilenameLocale = g_locale_from_utf8(outputFilenameUtf8, strlen(outputFilenameUtf8), NULL, NULL, NULL);

		FILE *outputFile;
		bool outputFileExists = false;
		if (!options.force) {
			// FIXME: Lame way of avoiding overwriting an existing file
			// (since it could theoretically be created between us testing and
			// opening for writing)
			if (g_file_test(outputFilename, G_FILE_TEST_EXISTS)) {
				outputFileExists = true;
			}
		}
		if (outputFileExists) {
			fprintf(stderr, "Destination file '%s' exists.\n", outputFilenameLocale);
			outputFile = NULL;
		} else {
#ifdef _MSC_VER
			fopen_s(&outputFile, outputFilenameLocale, "wb");
#else
			outputFile = fopen(outputFilenameLocale, "wb");
#endif
		}

		clock_t startTime = clock();

		if (outputFile != NULL) {
			if (options.rawChannelCount > 0 || writeWAVEHeader(outputFile, options.sampleRate, options.outputSampleFormat)) {
				State state = {NULL, {NULL, NULL, NULL, NULL, NULL, NULL}, service, outputFile, false, false, 0, 0, 0};
				state.outputFile = outputFile;
				if (options.rawChannelCount > 0) {
					for (int i = 0; i < 6; i++) {
						if (options.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
							state.rawSampleBuffer[i] = new float[options.bufferFrameCount];
						} else {
							state.rawSampleBuffer[i] = new MT32Emu::Bit16s[options.bufferFrameCount];
						}
					}
				} else {
					if (options.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
						state.stereoSampleBuffer = new float[options.bufferFrameCount * 2];
					} else {
						state.stereoSampleBuffer = new MT32Emu::Bit16s[options.bufferFrameCount * 2];
					}
				}
				gchar **inputFilename = options.inputFilenames;
				while (*inputFilename != NULL) {
					char *inputFilenameUtf8 = g_filename_to_utf8(*inputFilename, strlen(*inputFilename), NULL, NULL, NULL);
					char *inputFilenameLocale = g_locale_from_utf8(inputFilenameUtf8, strlen(inputFilenameUtf8), NULL, NULL, NULL);
					state.lastInputFile = *(inputFilename + 1) == NULL; // FIXME: This should actually be true if all subsequent files are sysex
					playFile(*inputFilename, inputFilenameLocale, options, state);
					inputFilename++;
					g_free(inputFilenameLocale);
					g_free(inputFilenameUtf8);
				}
				if (options.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
					delete[] static_cast<float *>(state.stereoSampleBuffer);
					for (int i = 0; i < 6; i++) {
						delete[] static_cast<float *>(state.rawSampleBuffer[i]);
					}
				} else {
					delete[] static_cast<MT32Emu::Bit16s *>(state.stereoSampleBuffer);
					for (int i = 0; i < 6; i++) {
						delete[] static_cast<MT32Emu::Bit16s *>(state.rawSampleBuffer[i]);
					}
				}
				if (options.rawChannelCount == 0 && !fillWAVESizes(outputFile, state.writtenFrames, options.outputSampleFormat)) {
					fprintf(stderr, "Error writing final sizes to WAVE header\n");
				}
			} else {
				fprintf(stderr, "Error writing WAVE header to '%s'\n", outputFilenameLocale);
			}
			fclose(outputFile);
			printf("Elapsed time: %f sec\n", float(clock() - startTime) / CLOCKS_PER_SEC);
		} else {
			fprintf(stderr, "Error opening file '%s' for writing.\n", outputFilenameLocale);
		}
		g_free(outputFilenameLocale);
		g_free(outputFilenameUtf8);
	} else {
		fprintf(stderr, "Error opening MT32Emu synthesizer.\n");
	}
	service.freeContext();

	if(options.outputFilename == NULL && outputFilename != NULL) {
		delete[] outputFilename;
	}
	freeOptions(&options);
	return 0;
}